

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

int opengv::absolute_pose::modules::gpnp3::init(EVP_PKEY_CTX *ctx)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  CoeffReturnType pdVar3;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  RealScalar RVar4;
  DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *this_00;
  RealScalar RVar5;
  RealScalar RVar6;
  RealScalar RVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [16];
  undefined1 auVar932 [16];
  undefined1 auVar933 [16];
  double c12w;
  double c03w;
  double c02w;
  double c01w;
  Vector3d temp;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffe6f8;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffe700;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffe720;
  Scalar SVar934;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffe728;
  
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffe728,in_stack_ffffffffffffe720);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (in_stack_ffffffffffffe700,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_ffffffffffffe6f8);
  this = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_ffffffffffffe6f8);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  dVar14 = (double)this * RVar4;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffe728,in_stack_ffffffffffffe720);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            (in_stack_ffffffffffffe700,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)this);
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *)
            Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  dVar15 = (double)this_00 * RVar4;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffe728,in_stack_ffffffffffffe720);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)this);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffe728,in_stack_ffffffffffffe720);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)this);
  RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  RVar7 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f0d65);
  dVar9 = *pSVar1 * -2.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f0d8d);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f0dad);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f0dd5);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = SVar934;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = dVar9;
  auVar628._8_8_ = 0;
  auVar628._0_8_ = -(dVar8 * 2.0 * *pSVar1);
  auVar16 = vfmadd213sd_fma(auVar16,auVar322,auVar628);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f0e23);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f0e4b);
  auVar629._8_8_ = 0;
  auVar629._0_8_ = auVar16._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *pSVar1;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar17,auVar323,auVar629);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f0e91);
  dVar8 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f0ecc);
  dVar9 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f0f07);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f0f42);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f0f7d);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f0fb8);
  dVar13 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f0ff3);
  *pSVar2 = auVar16._0_8_ + dVar8 + dVar9 + dVar10 + dVar11 + dVar12 + dVar13;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1011);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f103a);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f105b);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1086);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = SVar934;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = dVar8 * 2.0;
  auVar630._8_8_ = 0;
  auVar630._0_8_ = -(dVar9 * 2.0 * *pSVar1);
  auVar16 = vfmadd213sd_fma(auVar18,auVar324,auVar630);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f10de);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1109);
  auVar631._8_8_ = 0;
  auVar631._0_8_ = auVar16._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *pSVar1;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar19,auVar325,auVar631);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f115a);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1185);
  auVar632._8_8_ = 0;
  auVar632._0_8_ = auVar16._0_8_;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = dVar8 * 2.0;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar20,auVar326,auVar632);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f11bf);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f11ea);
  auVar633._8_8_ = 0;
  auVar633._0_8_ = auVar16._0_8_;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = dVar8 * 2.0;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar21,auVar327,auVar633);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1224);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f124f);
  auVar634._8_8_ = 0;
  auVar634._0_8_ = auVar16._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *pSVar1;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar22,auVar328,auVar634);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f12a0);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f12cb);
  auVar635._8_8_ = 0;
  auVar635._0_8_ = auVar16._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *pSVar1;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar23,auVar329,auVar635);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f131c);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1347);
  auVar636._8_8_ = 0;
  auVar636._0_8_ = auVar16._0_8_;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = dVar8 * 2.0;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar24,auVar330,auVar636);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1381);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f13ac);
  auVar637._8_8_ = 0;
  auVar637._0_8_ = auVar16._0_8_;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = dVar8 * 2.0;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar25,auVar331,auVar637);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f13e6);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1411);
  auVar638._8_8_ = 0;
  auVar638._0_8_ = auVar16._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *pSVar1;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar26,auVar332,auVar638);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1462);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f148d);
  auVar639._8_8_ = 0;
  auVar639._0_8_ = auVar16._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *pSVar1;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar27,auVar333,auVar639);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f14de);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1509);
  auVar640._8_8_ = 0;
  auVar640._0_8_ = auVar16._0_8_;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = dVar8 * 2.0;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar28,auVar334,auVar640);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f1543);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1564);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f158f);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f15b2);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f15dd);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = SVar934;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = dVar8 * -2.0;
  auVar641._8_8_ = 0;
  auVar641._0_8_ = -(dVar9 * 2.0 * *pSVar1);
  auVar16 = vfmadd213sd_fma(auVar29,auVar335,auVar641);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1637);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1662);
  auVar642._8_8_ = 0;
  auVar642._0_8_ = auVar16._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *pSVar1;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar30,auVar336,auVar642);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f16b1);
  dVar8 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f16f2);
  dVar9 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1733);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1774);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f17b5);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f17f6);
  dVar13 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f1837);
  *pSVar2 = auVar16._0_8_ + dVar8 + dVar9 + dVar10 + dVar11 + dVar12 + dVar13;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1858);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1881);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f18a2);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f18cd);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = SVar934;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = dVar8 * 2.0;
  auVar643._8_8_ = 0;
  auVar643._0_8_ = -(dVar9 * 2.0 * *pSVar1);
  auVar16 = vfmadd213sd_fma(auVar31,auVar337,auVar643);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1925);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1950);
  auVar644._8_8_ = 0;
  auVar644._0_8_ = auVar16._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *pSVar1;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar32,auVar338,auVar644);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f19a1);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f19cc);
  auVar645._8_8_ = 0;
  auVar645._0_8_ = auVar16._0_8_;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = dVar8 * 2.0;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar33,auVar339,auVar645);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1a06);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1a31);
  auVar646._8_8_ = 0;
  auVar646._0_8_ = auVar16._0_8_;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = dVar8 * 2.0;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar34,auVar340,auVar646);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1a6b);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1a96);
  auVar647._8_8_ = 0;
  auVar647._0_8_ = auVar16._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *pSVar1;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar35,auVar341,auVar647);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1ae7);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1b12);
  auVar648._8_8_ = 0;
  auVar648._0_8_ = auVar16._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *pSVar1;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar36,auVar342,auVar648);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1b63);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1b8e);
  auVar649._8_8_ = 0;
  auVar649._0_8_ = auVar16._0_8_;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = dVar8 * 2.0;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar37,auVar343,auVar649);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1bc8);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1bf3);
  auVar650._8_8_ = 0;
  auVar650._0_8_ = auVar16._0_8_;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = dVar8 * 2.0;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar38,auVar344,auVar650);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1c2d);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1c58);
  auVar651._8_8_ = 0;
  auVar651._0_8_ = auVar16._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *pSVar1;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar39,auVar345,auVar651);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1ca9);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1cd4);
  auVar652._8_8_ = 0;
  auVar652._0_8_ = auVar16._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *pSVar1;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar40,auVar346,auVar652);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1d25);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1d50);
  auVar653._8_8_ = 0;
  auVar653._0_8_ = auVar16._0_8_;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = dVar8 * 2.0;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar41,auVar347,auVar653);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f1d8a);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1dab);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1dd4);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1df5);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1e20);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = SVar934;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = dVar8 * 2.0;
  auVar654._8_8_ = 0;
  auVar654._0_8_ = -(dVar9 * 2.0 * *pSVar1);
  auVar16 = vfmadd213sd_fma(auVar42,auVar348,auVar654);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1e78);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1ea3);
  auVar655._8_8_ = 0;
  auVar655._0_8_ = auVar16._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *pSVar1;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar43,auVar349,auVar655);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1ef4);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1f1f);
  auVar656._8_8_ = 0;
  auVar656._0_8_ = auVar16._0_8_;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = dVar8 * 2.0;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar44,auVar350,auVar656);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1f59);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1f84);
  auVar657._8_8_ = 0;
  auVar657._0_8_ = auVar16._0_8_;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = dVar8 * 2.0;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar45,auVar351,auVar657);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1fbe);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f1fe9);
  auVar658._8_8_ = 0;
  auVar658._0_8_ = auVar16._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *pSVar1;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar46,auVar352,auVar658);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f203a);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2065);
  auVar659._8_8_ = 0;
  auVar659._0_8_ = auVar16._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *pSVar1;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar47,auVar353,auVar659);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f20b6);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f20e1);
  auVar660._8_8_ = 0;
  auVar660._0_8_ = auVar16._0_8_;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = dVar8 * 2.0;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar48,auVar354,auVar660);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f211b);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2146);
  auVar661._8_8_ = 0;
  auVar661._0_8_ = auVar16._0_8_;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = dVar8 * 2.0;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar49,auVar355,auVar661);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2180);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f21ab);
  auVar662._8_8_ = 0;
  auVar662._0_8_ = auVar16._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *pSVar1;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar50,auVar356,auVar662);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f21fc);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2227);
  auVar663._8_8_ = 0;
  auVar663._0_8_ = auVar16._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *pSVar1;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar51,auVar357,auVar663);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2278);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f22a3);
  auVar664._8_8_ = 0;
  auVar664._0_8_ = auVar16._0_8_;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = dVar8 * 2.0;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar52,auVar358,auVar664);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f22dd);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f22fe);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2329);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f234c);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2377);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = SVar934;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = dVar8 * -2.0;
  auVar665._8_8_ = 0;
  auVar665._0_8_ = -(dVar9 * 2.0 * *pSVar1);
  auVar16 = vfmadd213sd_fma(auVar53,auVar359,auVar665);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f23d1);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f23fc);
  auVar666._8_8_ = 0;
  auVar666._0_8_ = auVar16._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *pSVar1;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar54,auVar360,auVar666);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f244b);
  dVar8 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f248c);
  dVar9 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f24cd);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f250e);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f254f);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2590);
  dVar13 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f25d1);
  *pSVar2 = auVar16._0_8_ + dVar8 + dVar9 + dVar10 + dVar11 + dVar12 + dVar13;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f25f2);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f261b);
  SVar934 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f263c);
  dVar9 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2667);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = SVar934;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = dVar8 * 2.0;
  auVar667._8_8_ = 0;
  auVar667._0_8_ = -(dVar9 * 2.0 * *pSVar1);
  auVar16 = vfmadd213sd_fma(auVar55,auVar361,auVar667);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f26bf);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f26ea);
  auVar668._8_8_ = 0;
  auVar668._0_8_ = auVar16._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *pdVar3;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar56,auVar362,auVar668);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f273b);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2766);
  auVar669._8_8_ = 0;
  auVar669._0_8_ = auVar16._0_8_;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = dVar8 * 2.0;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar57,auVar363,auVar669);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f27a0);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f27cb);
  auVar670._8_8_ = 0;
  auVar670._0_8_ = auVar16._0_8_;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = dVar8 * 2.0;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar58,auVar364,auVar670);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2805);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2830);
  auVar671._8_8_ = 0;
  auVar671._0_8_ = auVar16._0_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *pSVar1;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar59,auVar365,auVar671);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2881);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f28ac);
  auVar672._8_8_ = 0;
  auVar672._0_8_ = auVar16._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *pdVar3;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar60,auVar366,auVar672);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f28fd);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2928);
  auVar673._8_8_ = 0;
  auVar673._0_8_ = auVar16._0_8_;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = dVar8 * 2.0;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar61,auVar367,auVar673);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2962);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f298d);
  auVar674._8_8_ = 0;
  auVar674._0_8_ = auVar16._0_8_;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = dVar8 * 2.0;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar62,auVar368,auVar674);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f29c7);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f29f2);
  auVar675._8_8_ = 0;
  auVar675._0_8_ = auVar16._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *pSVar1;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar63,auVar369,auVar675);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2a43);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2a6e);
  auVar676._8_8_ = 0;
  auVar676._0_8_ = auVar16._0_8_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *pdVar3;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar64,auVar370,auVar676);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2abf);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2aea);
  auVar677._8_8_ = 0;
  auVar677._0_8_ = auVar16._0_8_;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = dVar8 * 2.0;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar65,auVar371,auVar677);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f2b24);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2b45);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2b6e);
  SVar934 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2b8f);
  dVar9 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2bba);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = SVar934;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = dVar8 * 2.0;
  auVar678._8_8_ = 0;
  auVar678._0_8_ = -(dVar9 * 2.0 * *pSVar1);
  auVar16 = vfmadd213sd_fma(auVar66,auVar372,auVar678);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2c12);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2c3d);
  auVar679._8_8_ = 0;
  auVar679._0_8_ = auVar16._0_8_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *pdVar3;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar67,auVar373,auVar679);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2c8e);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2cb9);
  auVar680._8_8_ = 0;
  auVar680._0_8_ = auVar16._0_8_;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = dVar8 * 2.0;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar68,auVar374,auVar680);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2cf3);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2d1e);
  auVar681._8_8_ = 0;
  auVar681._0_8_ = auVar16._0_8_;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = dVar8 * 2.0;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar69,auVar375,auVar681);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2d58);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2d83);
  auVar682._8_8_ = 0;
  auVar682._0_8_ = auVar16._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *pSVar1;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar70,auVar376,auVar682);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2dd4);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2dff);
  auVar683._8_8_ = 0;
  auVar683._0_8_ = auVar16._0_8_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *pdVar3;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar71,auVar377,auVar683);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2e50);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2e7b);
  auVar684._8_8_ = 0;
  auVar684._0_8_ = auVar16._0_8_;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = dVar8 * 2.0;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar72,auVar378,auVar684);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2eb5);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2ee0);
  auVar685._8_8_ = 0;
  auVar685._0_8_ = auVar16._0_8_;
  auVar379._8_8_ = 0;
  auVar379._0_8_ = dVar8 * 2.0;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar73,auVar379,auVar685);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2f1a);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2f45);
  auVar686._8_8_ = 0;
  auVar686._0_8_ = auVar16._0_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *pSVar1;
  auVar380._8_8_ = 0;
  auVar380._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar74,auVar380,auVar686);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f2f96);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f2fc1);
  auVar687._8_8_ = 0;
  auVar687._0_8_ = auVar16._0_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *pdVar3;
  auVar381._8_8_ = 0;
  auVar381._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar75,auVar381,auVar687);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f3012);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f303d);
  auVar688._8_8_ = 0;
  auVar688._0_8_ = auVar16._0_8_;
  auVar382._8_8_ = 0;
  auVar382._0_8_ = dVar8 * 2.0;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar76,auVar382,auVar688);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f3077);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f3098);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f30c1);
  SVar934 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f30e2);
  dVar9 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f310d);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = SVar934;
  auVar383._8_8_ = 0;
  auVar383._0_8_ = dVar8 * 2.0;
  auVar689._8_8_ = 0;
  auVar689._0_8_ = -(dVar9 * 2.0 * *pSVar1);
  auVar16 = vfmadd213sd_fma(auVar77,auVar383,auVar689);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3165);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f3190);
  auVar690._8_8_ = 0;
  auVar690._0_8_ = auVar16._0_8_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *pdVar3;
  auVar384._8_8_ = 0;
  auVar384._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar78,auVar384,auVar690);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f31e1);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f320c);
  auVar691._8_8_ = 0;
  auVar691._0_8_ = auVar16._0_8_;
  auVar385._8_8_ = 0;
  auVar385._0_8_ = dVar8 * 2.0;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar79,auVar385,auVar691);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f3246);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3271);
  auVar692._8_8_ = 0;
  auVar692._0_8_ = auVar16._0_8_;
  auVar386._8_8_ = 0;
  auVar386._0_8_ = dVar8 * 2.0;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar80,auVar386,auVar692);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f32ab);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f32d6);
  auVar693._8_8_ = 0;
  auVar693._0_8_ = auVar16._0_8_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *pSVar1;
  auVar387._8_8_ = 0;
  auVar387._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar81,auVar387,auVar693);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3327);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f3352);
  auVar694._8_8_ = 0;
  auVar694._0_8_ = auVar16._0_8_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *pdVar3;
  auVar388._8_8_ = 0;
  auVar388._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar82,auVar388,auVar694);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f33a3);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f33ce);
  auVar695._8_8_ = 0;
  auVar695._0_8_ = auVar16._0_8_;
  auVar389._8_8_ = 0;
  auVar389._0_8_ = dVar8 * 2.0;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar83,auVar389,auVar695);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f3408);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3433);
  auVar696._8_8_ = 0;
  auVar696._0_8_ = auVar16._0_8_;
  auVar390._8_8_ = 0;
  auVar390._0_8_ = dVar8 * 2.0;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar84,auVar390,auVar696);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f346d);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3498);
  auVar697._8_8_ = 0;
  auVar697._0_8_ = auVar16._0_8_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *pSVar1;
  auVar391._8_8_ = 0;
  auVar391._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar85,auVar391,auVar697);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f34e9);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f3514);
  auVar698._8_8_ = 0;
  auVar698._0_8_ = auVar16._0_8_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *pdVar3;
  auVar392._8_8_ = 0;
  auVar392._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar86,auVar392,auVar698);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f3565);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3590);
  auVar699._8_8_ = 0;
  auVar699._0_8_ = auVar16._0_8_;
  auVar393._8_8_ = 0;
  auVar393._0_8_ = dVar8 * 2.0;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar87,auVar393,auVar699);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f35ca);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f3614);
  dVar9 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f3653);
  dVar8 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f367e);
  auVar700._8_8_ = 0;
  auVar700._0_8_ = -dVar14 + dVar9;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *pdVar3;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar88,auVar394,auVar700);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f36cf);
  dVar9 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f3710);
  dVar14 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f3751);
  dVar8 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f377c);
  auVar701._8_8_ = 0;
  auVar701._0_8_ = auVar16._0_8_ + dVar9 + dVar14;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *pdVar3;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar89,auVar395,auVar701);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f37cd);
  dVar9 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f380e);
  dVar14 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f384f);
  dVar8 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f387a);
  auVar702._8_8_ = 0;
  auVar702._0_8_ = auVar16._0_8_ + dVar9 + dVar14;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *pdVar3;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar90,auVar396,auVar702);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f38cb);
  dVar8 = pow(*pdVar3,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f390c);
  *pSVar2 = auVar16._0_8_ + dVar8;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f392d);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3958);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f397b);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f39a6);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = SVar934;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = dVar8 * -2.0;
  auVar703._8_8_ = 0;
  auVar703._0_8_ = -(dVar9 * 2.0 * *pSVar1);
  auVar16 = vfmadd213sd_fma(auVar91,auVar397,auVar703);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3a00);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3a2b);
  auVar704._8_8_ = 0;
  auVar704._0_8_ = auVar16._0_8_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *pSVar1;
  auVar398._8_8_ = 0;
  auVar398._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar92,auVar398,auVar704);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3a7a);
  dVar8 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3abb);
  dVar9 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3afc);
  dVar14 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3b3d);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3b7e);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3bbf);
  dVar12 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f3c01);
  *pSVar2 = auVar16._0_8_ + dVar8 + dVar9 + dVar14 + dVar10 + dVar11 + dVar12;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3c22);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3c4b);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3c6e);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3c99);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = SVar934;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = dVar8 * 2.0;
  auVar705._8_8_ = 0;
  auVar705._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar93,auVar399,auVar705);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3cdc);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3d07);
  auVar706._8_8_ = 0;
  auVar706._0_8_ = auVar16._0_8_;
  auVar400._8_8_ = 0;
  auVar400._0_8_ = dVar8 * 2.0;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar94,auVar400,auVar706);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3d3f);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3d6a);
  auVar707._8_8_ = 0;
  auVar707._0_8_ = auVar16._0_8_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *pSVar1;
  auVar401._8_8_ = 0;
  auVar401._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar95,auVar401,auVar707);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3db9);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3de4);
  auVar708._8_8_ = 0;
  auVar708._0_8_ = auVar16._0_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *pSVar1;
  auVar402._8_8_ = 0;
  auVar402._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar96,auVar402,auVar708);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3e35);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3e60);
  auVar709._8_8_ = 0;
  auVar709._0_8_ = auVar16._0_8_;
  auVar403._8_8_ = 0;
  auVar403._0_8_ = dVar8 * 2.0;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar97,auVar403,auVar709);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3e9a);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3ec5);
  auVar710._8_8_ = 0;
  auVar710._0_8_ = auVar16._0_8_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *pSVar1;
  auVar404._8_8_ = 0;
  auVar404._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar98,auVar404,auVar710);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3f16);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3f41);
  auVar711._8_8_ = 0;
  auVar711._0_8_ = auVar16._0_8_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *pSVar1;
  auVar405._8_8_ = 0;
  auVar405._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar99,auVar405,auVar711);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3f92);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3fbd);
  auVar712._8_8_ = 0;
  auVar712._0_8_ = auVar16._0_8_;
  auVar406._8_8_ = 0;
  auVar406._0_8_ = dVar8 * 2.0;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar100,auVar406,auVar712);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f3ff7);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4022);
  auVar713._8_8_ = 0;
  auVar713._0_8_ = auVar16._0_8_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *pSVar1;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar101,auVar407,auVar713);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4073);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f409e);
  auVar714._8_8_ = 0;
  auVar714._0_8_ = auVar16._0_8_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *pSVar1;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar102,auVar408,auVar714);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f40ef);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f411a);
  auVar715._8_8_ = 0;
  auVar715._0_8_ = auVar16._0_8_;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = dVar8 * 2.0;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar103,auVar409,auVar715);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f4155);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4176);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f41a1);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f41c4);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f41ef);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = SVar934;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = dVar8 * -2.0;
  auVar716._8_8_ = 0;
  auVar716._0_8_ = -(dVar9 * 2.0 * *pSVar1);
  auVar16 = vfmadd213sd_fma(auVar104,auVar410,auVar716);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4249);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4274);
  auVar717._8_8_ = 0;
  auVar717._0_8_ = auVar16._0_8_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *pSVar1;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar105,auVar411,auVar717);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f42c3);
  dVar8 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4304);
  dVar9 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4345);
  dVar14 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4386);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f43c7);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4408);
  dVar12 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f444a);
  *pSVar2 = auVar16._0_8_ + dVar8 + dVar9 + dVar14 + dVar10 + dVar11 + dVar12;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f446b);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4494);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f44b7);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f44e2);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = SVar934;
  auVar412._8_8_ = 0;
  auVar412._0_8_ = dVar8 * 2.0;
  auVar718._8_8_ = 0;
  auVar718._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar106,auVar412,auVar718);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4525);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4550);
  auVar719._8_8_ = 0;
  auVar719._0_8_ = auVar16._0_8_;
  auVar413._8_8_ = 0;
  auVar413._0_8_ = dVar8 * 2.0;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar107,auVar413,auVar719);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4588);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f45b3);
  auVar720._8_8_ = 0;
  auVar720._0_8_ = auVar16._0_8_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *pSVar1;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar108,auVar414,auVar720);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4602);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f462d);
  auVar721._8_8_ = 0;
  auVar721._0_8_ = auVar16._0_8_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *pSVar1;
  auVar415._8_8_ = 0;
  auVar415._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar109,auVar415,auVar721);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f467e);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f46a9);
  auVar722._8_8_ = 0;
  auVar722._0_8_ = auVar16._0_8_;
  auVar416._8_8_ = 0;
  auVar416._0_8_ = dVar8 * 2.0;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar110,auVar416,auVar722);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f46e3);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f470e);
  auVar723._8_8_ = 0;
  auVar723._0_8_ = auVar16._0_8_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *pSVar1;
  auVar417._8_8_ = 0;
  auVar417._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar111,auVar417,auVar723);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f475f);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f478a);
  auVar724._8_8_ = 0;
  auVar724._0_8_ = auVar16._0_8_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *pSVar1;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar112,auVar418,auVar724);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f47db);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4806);
  auVar725._8_8_ = 0;
  auVar725._0_8_ = auVar16._0_8_;
  auVar419._8_8_ = 0;
  auVar419._0_8_ = dVar8 * 2.0;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar113,auVar419,auVar725);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4840);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f486b);
  auVar726._8_8_ = 0;
  auVar726._0_8_ = auVar16._0_8_;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *pSVar1;
  auVar420._8_8_ = 0;
  auVar420._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar114,auVar420,auVar726);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f48bc);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f48e7);
  auVar727._8_8_ = 0;
  auVar727._0_8_ = auVar16._0_8_;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *pSVar1;
  auVar421._8_8_ = 0;
  auVar421._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar115,auVar421,auVar727);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4938);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4963);
  auVar728._8_8_ = 0;
  auVar728._0_8_ = auVar16._0_8_;
  auVar422._8_8_ = 0;
  auVar422._0_8_ = dVar8 * 2.0;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar116,auVar422,auVar728);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f499e);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f49bf);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f49e8);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4a0b);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4a36);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = SVar934;
  auVar423._8_8_ = 0;
  auVar423._0_8_ = dVar8 * 2.0;
  auVar729._8_8_ = 0;
  auVar729._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar117,auVar423,auVar729);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4a79);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4aa4);
  auVar730._8_8_ = 0;
  auVar730._0_8_ = auVar16._0_8_;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = dVar8 * 2.0;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar118,auVar424,auVar730);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4adc);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4b07);
  auVar731._8_8_ = 0;
  auVar731._0_8_ = auVar16._0_8_;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *pSVar1;
  auVar425._8_8_ = 0;
  auVar425._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar119,auVar425,auVar731);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4b56);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4b81);
  auVar732._8_8_ = 0;
  auVar732._0_8_ = auVar16._0_8_;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *pSVar1;
  auVar426._8_8_ = 0;
  auVar426._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar120,auVar426,auVar732);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4bd2);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4bfd);
  auVar733._8_8_ = 0;
  auVar733._0_8_ = auVar16._0_8_;
  auVar427._8_8_ = 0;
  auVar427._0_8_ = dVar8 * 2.0;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar121,auVar427,auVar733);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4c37);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4c62);
  auVar734._8_8_ = 0;
  auVar734._0_8_ = auVar16._0_8_;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *pSVar1;
  auVar428._8_8_ = 0;
  auVar428._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar122,auVar428,auVar734);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4cb3);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4cde);
  auVar735._8_8_ = 0;
  auVar735._0_8_ = auVar16._0_8_;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *pSVar1;
  auVar429._8_8_ = 0;
  auVar429._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar123,auVar429,auVar735);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4d2f);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4d5a);
  auVar736._8_8_ = 0;
  auVar736._0_8_ = auVar16._0_8_;
  auVar430._8_8_ = 0;
  auVar430._0_8_ = dVar8 * 2.0;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar124,auVar430,auVar736);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4d94);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4dbf);
  auVar737._8_8_ = 0;
  auVar737._0_8_ = auVar16._0_8_;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *pSVar1;
  auVar431._8_8_ = 0;
  auVar431._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar125,auVar431,auVar737);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4e10);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4e3b);
  auVar738._8_8_ = 0;
  auVar738._0_8_ = auVar16._0_8_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *pSVar1;
  auVar432._8_8_ = 0;
  auVar432._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar126,auVar432,auVar738);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4e8c);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4eb7);
  auVar739._8_8_ = 0;
  auVar739._0_8_ = auVar16._0_8_;
  auVar433._8_8_ = 0;
  auVar433._0_8_ = dVar8 * 2.0;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar127,auVar433,auVar739);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f4ef2);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4f13);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4f3e);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4f61);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4f8c);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = SVar934;
  auVar434._8_8_ = 0;
  auVar434._0_8_ = dVar8 * -2.0;
  auVar740._8_8_ = 0;
  auVar740._0_8_ = -(dVar9 * 2.0 * *pSVar1);
  auVar16 = vfmadd213sd_fma(auVar128,auVar434,auVar740);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f4fe6);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5011);
  auVar741._8_8_ = 0;
  auVar741._0_8_ = auVar16._0_8_;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *pSVar1;
  auVar435._8_8_ = 0;
  auVar435._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar129,auVar435,auVar741);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5060);
  dVar8 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f50a1);
  dVar9 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f50e2);
  dVar14 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5123);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5164);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f51a5);
  dVar12 = pow(*pSVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f51e7);
  *pSVar2 = auVar16._0_8_ + dVar8 + dVar9 + dVar14 + dVar10 + dVar11 + dVar12;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5208);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5231);
  SVar934 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5254);
  dVar9 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f527f);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = SVar934;
  auVar436._8_8_ = 0;
  auVar436._0_8_ = dVar8 * 2.0;
  auVar742._8_8_ = 0;
  auVar742._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar130,auVar436,auVar742);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f52c2);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f52ed);
  auVar743._8_8_ = 0;
  auVar743._0_8_ = auVar16._0_8_;
  auVar437._8_8_ = 0;
  auVar437._0_8_ = dVar8 * 2.0;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar131,auVar437,auVar743);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5325);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5350);
  auVar744._8_8_ = 0;
  auVar744._0_8_ = auVar16._0_8_;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *pSVar1;
  auVar438._8_8_ = 0;
  auVar438._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar132,auVar438,auVar744);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f539f);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f53ca);
  auVar745._8_8_ = 0;
  auVar745._0_8_ = auVar16._0_8_;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *pdVar3;
  auVar439._8_8_ = 0;
  auVar439._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar133,auVar439,auVar745);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f541b);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5446);
  auVar746._8_8_ = 0;
  auVar746._0_8_ = auVar16._0_8_;
  auVar440._8_8_ = 0;
  auVar440._0_8_ = dVar8 * 2.0;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar134,auVar440,auVar746);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5480);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f54ab);
  auVar747._8_8_ = 0;
  auVar747._0_8_ = auVar16._0_8_;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *pSVar1;
  auVar441._8_8_ = 0;
  auVar441._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar135,auVar441,auVar747);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f54fc);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5527);
  auVar748._8_8_ = 0;
  auVar748._0_8_ = auVar16._0_8_;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *pdVar3;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar136,auVar442,auVar748);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5578);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f55a3);
  auVar749._8_8_ = 0;
  auVar749._0_8_ = auVar16._0_8_;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = dVar8 * 2.0;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar137,auVar443,auVar749);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f55dd);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5608);
  auVar750._8_8_ = 0;
  auVar750._0_8_ = auVar16._0_8_;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *pSVar1;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar138,auVar444,auVar750);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5659);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5684);
  auVar751._8_8_ = 0;
  auVar751._0_8_ = auVar16._0_8_;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *pdVar3;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar139,auVar445,auVar751);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f56d5);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5700);
  auVar752._8_8_ = 0;
  auVar752._0_8_ = auVar16._0_8_;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = dVar8 * 2.0;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar140,auVar446,auVar752);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f573b);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f575c);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5785);
  SVar934 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f57a8);
  dVar9 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f57d3);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = SVar934;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = dVar8 * 2.0;
  auVar753._8_8_ = 0;
  auVar753._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar141,auVar447,auVar753);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5816);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5841);
  auVar754._8_8_ = 0;
  auVar754._0_8_ = auVar16._0_8_;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = dVar8 * 2.0;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar142,auVar448,auVar754);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5879);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f58a4);
  auVar755._8_8_ = 0;
  auVar755._0_8_ = auVar16._0_8_;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *pSVar1;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar143,auVar449,auVar755);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f58f3);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f591e);
  auVar756._8_8_ = 0;
  auVar756._0_8_ = auVar16._0_8_;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *pdVar3;
  auVar450._8_8_ = 0;
  auVar450._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar144,auVar450,auVar756);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f596f);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f599a);
  auVar757._8_8_ = 0;
  auVar757._0_8_ = auVar16._0_8_;
  auVar451._8_8_ = 0;
  auVar451._0_8_ = dVar8 * 2.0;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar145,auVar451,auVar757);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f59d4);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f59ff);
  auVar758._8_8_ = 0;
  auVar758._0_8_ = auVar16._0_8_;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *pSVar1;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar146,auVar452,auVar758);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5a50);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5a7b);
  auVar759._8_8_ = 0;
  auVar759._0_8_ = auVar16._0_8_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *pdVar3;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar147,auVar453,auVar759);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5acc);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5af7);
  auVar760._8_8_ = 0;
  auVar760._0_8_ = auVar16._0_8_;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = dVar8 * 2.0;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar148,auVar454,auVar760);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5b31);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5b5c);
  auVar761._8_8_ = 0;
  auVar761._0_8_ = auVar16._0_8_;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *pSVar1;
  auVar455._8_8_ = 0;
  auVar455._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar149,auVar455,auVar761);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5bad);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5bd8);
  auVar762._8_8_ = 0;
  auVar762._0_8_ = auVar16._0_8_;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *pdVar3;
  auVar456._8_8_ = 0;
  auVar456._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar150,auVar456,auVar762);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5c29);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5c54);
  auVar763._8_8_ = 0;
  auVar763._0_8_ = auVar16._0_8_;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = dVar8 * 2.0;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar151,auVar457,auVar763);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f5c8f);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5cb0);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5cd9);
  SVar934 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5cfc);
  dVar9 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5d27);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = SVar934;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = dVar8 * 2.0;
  auVar764._8_8_ = 0;
  auVar764._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar152,auVar458,auVar764);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5d6a);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5d95);
  auVar765._8_8_ = 0;
  auVar765._0_8_ = auVar16._0_8_;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = dVar8 * 2.0;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar153,auVar459,auVar765);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5dcd);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5df8);
  auVar766._8_8_ = 0;
  auVar766._0_8_ = auVar16._0_8_;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *pSVar1;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar154,auVar460,auVar766);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5e47);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5e72);
  auVar767._8_8_ = 0;
  auVar767._0_8_ = auVar16._0_8_;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *pdVar3;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar155,auVar461,auVar767);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5ec3);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5eee);
  auVar768._8_8_ = 0;
  auVar768._0_8_ = auVar16._0_8_;
  auVar462._8_8_ = 0;
  auVar462._0_8_ = dVar8 * 2.0;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar156,auVar462,auVar768);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5f28);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5f53);
  auVar769._8_8_ = 0;
  auVar769._0_8_ = auVar16._0_8_;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *pSVar1;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar157,auVar463,auVar769);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f5fa4);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f5fcf);
  auVar770._8_8_ = 0;
  auVar770._0_8_ = auVar16._0_8_;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *pdVar3;
  auVar464._8_8_ = 0;
  auVar464._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar158,auVar464,auVar770);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f6020);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f604b);
  auVar771._8_8_ = 0;
  auVar771._0_8_ = auVar16._0_8_;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = dVar8 * 2.0;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar159,auVar465,auVar771);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f6085);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f60b0);
  auVar772._8_8_ = 0;
  auVar772._0_8_ = auVar16._0_8_;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *pSVar1;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar160,auVar466,auVar772);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6101);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f612c);
  auVar773._8_8_ = 0;
  auVar773._0_8_ = auVar16._0_8_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *pdVar3;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar161,auVar467,auVar773);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f617d);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f61a8);
  auVar774._8_8_ = 0;
  auVar774._0_8_ = auVar16._0_8_;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = dVar8 * 2.0;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar162,auVar468,auVar774);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f61e3);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f622d);
  dVar9 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f626e);
  dVar14 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f62af);
  dVar10 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f62ee);
  dVar8 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f6319);
  auVar775._8_8_ = 0;
  auVar775._0_8_ = -dVar15 + dVar9 + dVar14 + dVar10;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *pdVar3;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar163,auVar469,auVar775);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f636a);
  dVar9 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f63ab);
  dVar8 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f63d6);
  auVar776._8_8_ = 0;
  auVar776._0_8_ = auVar16._0_8_ + dVar9;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *pdVar3;
  auVar470._8_8_ = 0;
  auVar470._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar164,auVar470,auVar776);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f6427);
  dVar9 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f6468);
  dVar8 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f6493);
  auVar777._8_8_ = 0;
  auVar777._0_8_ = auVar16._0_8_ + dVar9;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *pdVar3;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar165,auVar471,auVar777);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f64e4);
  dVar8 = pow(*pdVar3,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f6526);
  *pSVar2 = auVar16._0_8_ + dVar8;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6547);
  dVar9 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6577);
  dVar14 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f65b8);
  dVar15 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f65f9);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f663a);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f667b);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f66ba);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f66e5);
  auVar778._8_8_ = 0;
  auVar778._0_8_ = dVar9 + dVar14 + dVar15 + dVar10 + dVar11 + dVar12;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *pSVar1;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar166,auVar472,auVar778);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6736);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6761);
  auVar779._8_8_ = 0;
  auVar779._0_8_ = auVar16._0_8_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *pSVar1;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar167,auVar473,auVar779);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f67b2);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f67dd);
  auVar780._8_8_ = 0;
  auVar780._0_8_ = auVar16._0_8_;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *pSVar1;
  auVar474._8_8_ = 0;
  auVar474._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar168,auVar474,auVar780);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f682f);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6850);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6879);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f689c);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f68c7);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = SVar934;
  auVar475._8_8_ = 0;
  auVar475._0_8_ = dVar8 * 2.0;
  auVar781._8_8_ = 0;
  auVar781._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar169,auVar475,auVar781);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f690a);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6935);
  auVar782._8_8_ = 0;
  auVar782._0_8_ = auVar16._0_8_;
  auVar476._8_8_ = 0;
  auVar476._0_8_ = dVar8 * 2.0;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar170,auVar476,auVar782);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f696d);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6998);
  auVar783._8_8_ = 0;
  auVar783._0_8_ = auVar16._0_8_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *pSVar1;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar171,auVar477,auVar783);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f69e7);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6a12);
  auVar784._8_8_ = 0;
  auVar784._0_8_ = auVar16._0_8_;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *pSVar1;
  auVar478._8_8_ = 0;
  auVar478._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar172,auVar478,auVar784);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6a63);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6a8e);
  auVar785._8_8_ = 0;
  auVar785._0_8_ = auVar16._0_8_;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = dVar8 * 2.0;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar173,auVar479,auVar785);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6ac8);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6af3);
  auVar786._8_8_ = 0;
  auVar786._0_8_ = auVar16._0_8_;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *pSVar1;
  auVar480._8_8_ = 0;
  auVar480._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar174,auVar480,auVar786);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6b44);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6b6f);
  auVar787._8_8_ = 0;
  auVar787._0_8_ = auVar16._0_8_;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *pSVar1;
  auVar481._8_8_ = 0;
  auVar481._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar175,auVar481,auVar787);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6bc0);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6beb);
  auVar788._8_8_ = 0;
  auVar788._0_8_ = auVar16._0_8_;
  auVar482._8_8_ = 0;
  auVar482._0_8_ = dVar8 * 2.0;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar176,auVar482,auVar788);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6c25);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6c50);
  auVar789._8_8_ = 0;
  auVar789._0_8_ = auVar16._0_8_;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *pSVar1;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar177,auVar483,auVar789);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6ca1);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6ccc);
  auVar790._8_8_ = 0;
  auVar790._0_8_ = auVar16._0_8_;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *pSVar1;
  auVar484._8_8_ = 0;
  auVar484._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar178,auVar484,auVar790);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6d1d);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6d48);
  auVar791._8_8_ = 0;
  auVar791._0_8_ = auVar16._0_8_;
  auVar485._8_8_ = 0;
  auVar485._0_8_ = dVar8 * 2.0;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar179,auVar485,auVar791);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f6d83);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6da4);
  dVar9 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6dd4);
  dVar14 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6e15);
  dVar15 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6e56);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6e97);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6ed8);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6f17);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6f42);
  auVar792._8_8_ = 0;
  auVar792._0_8_ = dVar9 + dVar14 + dVar15 + dVar10 + dVar11 + dVar12;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *pSVar1;
  auVar486._8_8_ = 0;
  auVar486._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar180,auVar486,auVar792);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6f93);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f6fbe);
  auVar793._8_8_ = 0;
  auVar793._0_8_ = auVar16._0_8_;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *pSVar1;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar181,auVar487,auVar793);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f700f);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f703a);
  auVar794._8_8_ = 0;
  auVar794._0_8_ = auVar16._0_8_;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *pSVar1;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar182,auVar488,auVar794);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f708c);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f70ad);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f70d6);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f70f9);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7124);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = SVar934;
  auVar489._8_8_ = 0;
  auVar489._0_8_ = dVar8 * 2.0;
  auVar795._8_8_ = 0;
  auVar795._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar183,auVar489,auVar795);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7167);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7192);
  auVar796._8_8_ = 0;
  auVar796._0_8_ = auVar16._0_8_;
  auVar490._8_8_ = 0;
  auVar490._0_8_ = dVar8 * 2.0;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar184,auVar490,auVar796);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f71ca);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f71f5);
  auVar797._8_8_ = 0;
  auVar797._0_8_ = auVar16._0_8_;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *pSVar1;
  auVar491._8_8_ = 0;
  auVar491._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar185,auVar491,auVar797);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7244);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f726f);
  auVar798._8_8_ = 0;
  auVar798._0_8_ = auVar16._0_8_;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *pSVar1;
  auVar492._8_8_ = 0;
  auVar492._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar186,auVar492,auVar798);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f72c0);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f72eb);
  auVar799._8_8_ = 0;
  auVar799._0_8_ = auVar16._0_8_;
  auVar493._8_8_ = 0;
  auVar493._0_8_ = dVar8 * 2.0;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar187,auVar493,auVar799);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7325);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7350);
  auVar800._8_8_ = 0;
  auVar800._0_8_ = auVar16._0_8_;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *pSVar1;
  auVar494._8_8_ = 0;
  auVar494._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar188,auVar494,auVar800);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f73a1);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f73cc);
  auVar801._8_8_ = 0;
  auVar801._0_8_ = auVar16._0_8_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *pSVar1;
  auVar495._8_8_ = 0;
  auVar495._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar189,auVar495,auVar801);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f741d);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7448);
  auVar802._8_8_ = 0;
  auVar802._0_8_ = auVar16._0_8_;
  auVar496._8_8_ = 0;
  auVar496._0_8_ = dVar8 * 2.0;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar190,auVar496,auVar802);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7482);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f74ad);
  auVar803._8_8_ = 0;
  auVar803._0_8_ = auVar16._0_8_;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *pSVar1;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar191,auVar497,auVar803);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f74fe);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7529);
  auVar804._8_8_ = 0;
  auVar804._0_8_ = auVar16._0_8_;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *pSVar1;
  auVar498._8_8_ = 0;
  auVar498._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar192,auVar498,auVar804);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f757a);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f75a5);
  auVar805._8_8_ = 0;
  auVar805._0_8_ = auVar16._0_8_;
  auVar499._8_8_ = 0;
  auVar499._0_8_ = dVar8 * 2.0;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar193,auVar499,auVar805);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f75e0);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7601);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f762a);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f764d);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7678);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = SVar934;
  auVar500._8_8_ = 0;
  auVar500._0_8_ = dVar8 * 2.0;
  auVar806._8_8_ = 0;
  auVar806._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar194,auVar500,auVar806);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f76bb);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f76e6);
  auVar807._8_8_ = 0;
  auVar807._0_8_ = auVar16._0_8_;
  auVar501._8_8_ = 0;
  auVar501._0_8_ = dVar8 * 2.0;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar195,auVar501,auVar807);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f771e);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7749);
  auVar808._8_8_ = 0;
  auVar808._0_8_ = auVar16._0_8_;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *pSVar1;
  auVar502._8_8_ = 0;
  auVar502._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar196,auVar502,auVar808);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7798);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f77c3);
  auVar809._8_8_ = 0;
  auVar809._0_8_ = auVar16._0_8_;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *pSVar1;
  auVar503._8_8_ = 0;
  auVar503._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar197,auVar503,auVar809);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7814);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f783f);
  auVar810._8_8_ = 0;
  auVar810._0_8_ = auVar16._0_8_;
  auVar504._8_8_ = 0;
  auVar504._0_8_ = dVar8 * 2.0;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar198,auVar504,auVar810);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7879);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f78a4);
  auVar811._8_8_ = 0;
  auVar811._0_8_ = auVar16._0_8_;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *pSVar1;
  auVar505._8_8_ = 0;
  auVar505._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar199,auVar505,auVar811);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f78f5);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7920);
  auVar812._8_8_ = 0;
  auVar812._0_8_ = auVar16._0_8_;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *pSVar1;
  auVar506._8_8_ = 0;
  auVar506._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar200,auVar506,auVar812);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7971);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f799c);
  auVar813._8_8_ = 0;
  auVar813._0_8_ = auVar16._0_8_;
  auVar507._8_8_ = 0;
  auVar507._0_8_ = dVar8 * 2.0;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar201,auVar507,auVar813);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f79d6);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7a01);
  auVar814._8_8_ = 0;
  auVar814._0_8_ = auVar16._0_8_;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *pSVar1;
  auVar508._8_8_ = 0;
  auVar508._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar202,auVar508,auVar814);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7a52);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7a7d);
  auVar815._8_8_ = 0;
  auVar815._0_8_ = auVar16._0_8_;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *pSVar1;
  auVar509._8_8_ = 0;
  auVar509._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar203,auVar509,auVar815);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7ace);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7af9);
  auVar816._8_8_ = 0;
  auVar816._0_8_ = auVar16._0_8_;
  auVar510._8_8_ = 0;
  auVar510._0_8_ = dVar8 * 2.0;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar204,auVar510,auVar816);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f7b34);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7b55);
  dVar9 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7b85);
  dVar14 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7bc6);
  dVar15 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7c07);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7c48);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7c89);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7cc8);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7cf3);
  auVar817._8_8_ = 0;
  auVar817._0_8_ = dVar9 + dVar14 + dVar15 + dVar10 + dVar11 + dVar12;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *pSVar1;
  auVar511._8_8_ = 0;
  auVar511._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar205,auVar511,auVar817);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7d44);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7d6f);
  auVar818._8_8_ = 0;
  auVar818._0_8_ = auVar16._0_8_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *pSVar1;
  auVar512._8_8_ = 0;
  auVar512._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar206,auVar512,auVar818);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7dc0);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7deb);
  auVar819._8_8_ = 0;
  auVar819._0_8_ = auVar16._0_8_;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *pSVar1;
  auVar513._8_8_ = 0;
  auVar513._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar207,auVar513,auVar819);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f7e3d);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f7e5e);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7e87);
  SVar934 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f7eaa);
  dVar9 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7ed5);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = SVar934;
  auVar514._8_8_ = 0;
  auVar514._0_8_ = dVar8 * 2.0;
  auVar820._8_8_ = 0;
  auVar820._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar208,auVar514,auVar820);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f7f18);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7f43);
  auVar821._8_8_ = 0;
  auVar821._0_8_ = auVar16._0_8_;
  auVar515._8_8_ = 0;
  auVar515._0_8_ = dVar8 * 2.0;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar209,auVar515,auVar821);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f7f7b);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7fa6);
  auVar822._8_8_ = 0;
  auVar822._0_8_ = auVar16._0_8_;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *pSVar1;
  auVar516._8_8_ = 0;
  auVar516._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar210,auVar516,auVar822);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f7ff5);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8020);
  auVar823._8_8_ = 0;
  auVar823._0_8_ = auVar16._0_8_;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *pdVar3;
  auVar517._8_8_ = 0;
  auVar517._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar211,auVar517,auVar823);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8071);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f809c);
  auVar824._8_8_ = 0;
  auVar824._0_8_ = auVar16._0_8_;
  auVar518._8_8_ = 0;
  auVar518._0_8_ = dVar8 * 2.0;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar212,auVar518,auVar824);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f80d6);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8101);
  auVar825._8_8_ = 0;
  auVar825._0_8_ = auVar16._0_8_;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *pSVar1;
  auVar519._8_8_ = 0;
  auVar519._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar213,auVar519,auVar825);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8152);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f817d);
  auVar826._8_8_ = 0;
  auVar826._0_8_ = auVar16._0_8_;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *pdVar3;
  auVar520._8_8_ = 0;
  auVar520._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar214,auVar520,auVar826);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f81ce);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f81f9);
  auVar827._8_8_ = 0;
  auVar827._0_8_ = auVar16._0_8_;
  auVar521._8_8_ = 0;
  auVar521._0_8_ = dVar8 * 2.0;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar215,auVar521,auVar827);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8233);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f825e);
  auVar828._8_8_ = 0;
  auVar828._0_8_ = auVar16._0_8_;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *pSVar1;
  auVar522._8_8_ = 0;
  auVar522._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar216,auVar522,auVar828);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f82af);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f82da);
  auVar829._8_8_ = 0;
  auVar829._0_8_ = auVar16._0_8_;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *pdVar3;
  auVar523._8_8_ = 0;
  auVar523._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar217,auVar523,auVar829);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f832b);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8356);
  auVar830._8_8_ = 0;
  auVar830._0_8_ = auVar16._0_8_;
  auVar524._8_8_ = 0;
  auVar524._0_8_ = dVar8 * 2.0;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar218,auVar524,auVar830);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f8391);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f83b2);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f83db);
  SVar934 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f83fe);
  dVar9 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8429);
  auVar219._8_8_ = 0;
  auVar219._0_8_ = SVar934;
  auVar525._8_8_ = 0;
  auVar525._0_8_ = dVar8 * 2.0;
  auVar831._8_8_ = 0;
  auVar831._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar219,auVar525,auVar831);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f846c);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8497);
  auVar832._8_8_ = 0;
  auVar832._0_8_ = auVar16._0_8_;
  auVar526._8_8_ = 0;
  auVar526._0_8_ = dVar8 * 2.0;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar220,auVar526,auVar832);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f84cf);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f84fa);
  auVar833._8_8_ = 0;
  auVar833._0_8_ = auVar16._0_8_;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *pSVar1;
  auVar527._8_8_ = 0;
  auVar527._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar221,auVar527,auVar833);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8549);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8574);
  auVar834._8_8_ = 0;
  auVar834._0_8_ = auVar16._0_8_;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *pdVar3;
  auVar528._8_8_ = 0;
  auVar528._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar222,auVar528,auVar834);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f85c5);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f85f0);
  auVar835._8_8_ = 0;
  auVar835._0_8_ = auVar16._0_8_;
  auVar529._8_8_ = 0;
  auVar529._0_8_ = dVar8 * 2.0;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar223,auVar529,auVar835);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f862a);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8655);
  auVar836._8_8_ = 0;
  auVar836._0_8_ = auVar16._0_8_;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = *pSVar1;
  auVar530._8_8_ = 0;
  auVar530._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar224,auVar530,auVar836);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f86a6);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f86d1);
  auVar837._8_8_ = 0;
  auVar837._0_8_ = auVar16._0_8_;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *pdVar3;
  auVar531._8_8_ = 0;
  auVar531._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar225,auVar531,auVar837);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8722);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f874d);
  auVar838._8_8_ = 0;
  auVar838._0_8_ = auVar16._0_8_;
  auVar532._8_8_ = 0;
  auVar532._0_8_ = dVar8 * 2.0;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar226,auVar532,auVar838);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8787);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f87b2);
  auVar839._8_8_ = 0;
  auVar839._0_8_ = auVar16._0_8_;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *pSVar1;
  auVar533._8_8_ = 0;
  auVar533._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar227,auVar533,auVar839);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8803);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f882e);
  auVar840._8_8_ = 0;
  auVar840._0_8_ = auVar16._0_8_;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *pdVar3;
  auVar534._8_8_ = 0;
  auVar534._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar228,auVar534,auVar840);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f887f);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f88aa);
  auVar841._8_8_ = 0;
  auVar841._0_8_ = auVar16._0_8_;
  auVar535._8_8_ = 0;
  auVar535._0_8_ = dVar8 * 2.0;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar229,auVar535,auVar841);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f88e5);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8906);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f892f);
  SVar934 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8952);
  dVar9 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f897d);
  auVar230._8_8_ = 0;
  auVar230._0_8_ = SVar934;
  auVar536._8_8_ = 0;
  auVar536._0_8_ = dVar8 * 2.0;
  auVar842._8_8_ = 0;
  auVar842._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar230,auVar536,auVar842);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f89c0);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f89eb);
  auVar843._8_8_ = 0;
  auVar843._0_8_ = auVar16._0_8_;
  auVar537._8_8_ = 0;
  auVar537._0_8_ = dVar8 * 2.0;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar231,auVar537,auVar843);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8a23);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8a4e);
  auVar844._8_8_ = 0;
  auVar844._0_8_ = auVar16._0_8_;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *pSVar1;
  auVar538._8_8_ = 0;
  auVar538._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar232,auVar538,auVar844);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8a9d);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8ac8);
  auVar845._8_8_ = 0;
  auVar845._0_8_ = auVar16._0_8_;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *pdVar3;
  auVar539._8_8_ = 0;
  auVar539._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar233,auVar539,auVar845);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8b19);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8b44);
  auVar846._8_8_ = 0;
  auVar846._0_8_ = auVar16._0_8_;
  auVar540._8_8_ = 0;
  auVar540._0_8_ = dVar8 * 2.0;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar234,auVar540,auVar846);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8b7e);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8ba9);
  auVar847._8_8_ = 0;
  auVar847._0_8_ = auVar16._0_8_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = *pSVar1;
  auVar541._8_8_ = 0;
  auVar541._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar235,auVar541,auVar847);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8bfa);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8c25);
  auVar848._8_8_ = 0;
  auVar848._0_8_ = auVar16._0_8_;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *pdVar3;
  auVar542._8_8_ = 0;
  auVar542._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar236,auVar542,auVar848);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8c76);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8ca1);
  auVar849._8_8_ = 0;
  auVar849._0_8_ = auVar16._0_8_;
  auVar543._8_8_ = 0;
  auVar543._0_8_ = dVar8 * 2.0;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar237,auVar543,auVar849);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8cdb);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8d06);
  auVar850._8_8_ = 0;
  auVar850._0_8_ = auVar16._0_8_;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *pSVar1;
  auVar544._8_8_ = 0;
  auVar544._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar238,auVar544,auVar850);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8d57);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8d82);
  auVar851._8_8_ = 0;
  auVar851._0_8_ = auVar16._0_8_;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = *pdVar3;
  auVar545._8_8_ = 0;
  auVar545._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar239,auVar545,auVar851);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8dd3);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f8dfe);
  auVar852._8_8_ = 0;
  auVar852._0_8_ = auVar16._0_8_;
  auVar546._8_8_ = 0;
  auVar546._0_8_ = dVar8 * 2.0;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar240,auVar546,auVar852);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f8e39);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8e83);
  dVar9 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8ec4);
  dVar14 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8f05);
  dVar15 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8f44);
  dVar8 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8f6f);
  auVar853._8_8_ = 0;
  auVar853._0_8_ = -(RVar4 * RVar5) + dVar9 + dVar14 + dVar15;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *pdVar3;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar241,auVar547,auVar853);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f8fc0);
  dVar9 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f9001);
  dVar8 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f902c);
  auVar854._8_8_ = 0;
  auVar854._0_8_ = auVar16._0_8_ + dVar9;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = *pdVar3;
  auVar548._8_8_ = 0;
  auVar548._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar242,auVar548,auVar854);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f907d);
  dVar9 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f90be);
  dVar8 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f90e9);
  auVar855._8_8_ = 0;
  auVar855._0_8_ = auVar16._0_8_ + dVar9;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *pdVar3;
  auVar549._8_8_ = 0;
  auVar549._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar243,auVar549,auVar855);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8f913a);
  dVar8 = pow(*pdVar3,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f917c);
  *pSVar2 = auVar16._0_8_ + dVar8;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f919f);
  dVar9 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f91cf);
  dVar14 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9210);
  dVar15 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9251);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9292);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f92d3);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9314);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f933f);
  auVar856._8_8_ = 0;
  auVar856._0_8_ = dVar9 + dVar14 + dVar15 + dVar10 + dVar11 + dVar12;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = *pSVar1;
  auVar550._8_8_ = 0;
  auVar550._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar244,auVar550,auVar856);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9390);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f93bb);
  auVar857._8_8_ = 0;
  auVar857._0_8_ = auVar16._0_8_;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = *pSVar1;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar245,auVar551,auVar857);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f940c);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9437);
  auVar858._8_8_ = 0;
  auVar858._0_8_ = auVar16._0_8_;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = *pSVar1;
  auVar552._8_8_ = 0;
  auVar552._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar246,auVar552,auVar858);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f9489);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f94ac);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f94d7);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f94fa);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9525);
  auVar247._8_8_ = 0;
  auVar247._0_8_ = SVar934;
  auVar553._8_8_ = 0;
  auVar553._0_8_ = dVar8 * 2.0;
  auVar859._8_8_ = 0;
  auVar859._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar247,auVar553,auVar859);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9568);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9593);
  auVar860._8_8_ = 0;
  auVar860._0_8_ = auVar16._0_8_;
  auVar554._8_8_ = 0;
  auVar554._0_8_ = dVar8 * 2.0;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar248,auVar554,auVar860);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f95cd);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f95f8);
  auVar861._8_8_ = 0;
  auVar861._0_8_ = auVar16._0_8_;
  auVar555._8_8_ = 0;
  auVar555._0_8_ = dVar8 * 2.0;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar249,auVar555,auVar861);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9632);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f965d);
  auVar862._8_8_ = 0;
  auVar862._0_8_ = auVar16._0_8_;
  auVar556._8_8_ = 0;
  auVar556._0_8_ = dVar8 * 2.0;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar250,auVar556,auVar862);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9697);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f96c2);
  auVar863._8_8_ = 0;
  auVar863._0_8_ = auVar16._0_8_;
  auVar557._8_8_ = 0;
  auVar557._0_8_ = dVar8 * 2.0;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar251,auVar557,auVar863);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f96fc);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9727);
  auVar864._8_8_ = 0;
  auVar864._0_8_ = auVar16._0_8_;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = *pSVar1;
  auVar558._8_8_ = 0;
  auVar558._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar252,auVar558,auVar864);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9778);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f97a3);
  auVar865._8_8_ = 0;
  auVar865._0_8_ = auVar16._0_8_;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = *pSVar1;
  auVar559._8_8_ = 0;
  auVar559._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar253,auVar559,auVar865);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f97f4);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f981f);
  auVar866._8_8_ = 0;
  auVar866._0_8_ = auVar16._0_8_;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = *pSVar1;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar254,auVar560,auVar866);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9870);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f989b);
  auVar867._8_8_ = 0;
  auVar867._0_8_ = auVar16._0_8_;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = *pSVar1;
  auVar561._8_8_ = 0;
  auVar561._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar255,auVar561,auVar867);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f98ec);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9917);
  auVar868._8_8_ = 0;
  auVar868._0_8_ = auVar16._0_8_;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = *pSVar1;
  auVar562._8_8_ = 0;
  auVar562._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar256,auVar562,auVar868);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9968);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9993);
  auVar869._8_8_ = 0;
  auVar869._0_8_ = auVar16._0_8_;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = *pSVar1;
  auVar563._8_8_ = 0;
  auVar563._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar257,auVar563,auVar869);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f99e5);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9a08);
  dVar9 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9a38);
  dVar14 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9a79);
  dVar15 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9aba);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9afb);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9b3c);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9b7d);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9ba8);
  auVar870._8_8_ = 0;
  auVar870._0_8_ = dVar9 + dVar14 + dVar15 + dVar10 + dVar11 + dVar12;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = *pSVar1;
  auVar564._8_8_ = 0;
  auVar564._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar258,auVar564,auVar870);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9bf9);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9c24);
  auVar871._8_8_ = 0;
  auVar871._0_8_ = auVar16._0_8_;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = *pSVar1;
  auVar565._8_8_ = 0;
  auVar565._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar259,auVar565,auVar871);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9c75);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9ca0);
  auVar872._8_8_ = 0;
  auVar872._0_8_ = auVar16._0_8_;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *pSVar1;
  auVar566._8_8_ = 0;
  auVar566._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar260,auVar566,auVar872);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8f9cf2);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9d15);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9d40);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9d63);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9d8e);
  auVar261._8_8_ = 0;
  auVar261._0_8_ = SVar934;
  auVar567._8_8_ = 0;
  auVar567._0_8_ = dVar8 * 2.0;
  auVar873._8_8_ = 0;
  auVar873._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar261,auVar567,auVar873);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9dd1);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9dfc);
  auVar874._8_8_ = 0;
  auVar874._0_8_ = auVar16._0_8_;
  auVar568._8_8_ = 0;
  auVar568._0_8_ = dVar8 * 2.0;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar262,auVar568,auVar874);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9e36);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9e61);
  auVar875._8_8_ = 0;
  auVar875._0_8_ = auVar16._0_8_;
  auVar569._8_8_ = 0;
  auVar569._0_8_ = dVar8 * 2.0;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar263,auVar569,auVar875);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9e9b);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9ec6);
  auVar876._8_8_ = 0;
  auVar876._0_8_ = auVar16._0_8_;
  auVar570._8_8_ = 0;
  auVar570._0_8_ = dVar8 * 2.0;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar264,auVar570,auVar876);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9f00);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9f2b);
  auVar877._8_8_ = 0;
  auVar877._0_8_ = auVar16._0_8_;
  auVar571._8_8_ = 0;
  auVar571._0_8_ = dVar8 * 2.0;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar265,auVar571,auVar877);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9f65);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9f90);
  auVar878._8_8_ = 0;
  auVar878._0_8_ = auVar16._0_8_;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = *pSVar1;
  auVar572._8_8_ = 0;
  auVar572._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar266,auVar572,auVar878);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8f9fe1);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa00c);
  auVar879._8_8_ = 0;
  auVar879._0_8_ = auVar16._0_8_;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = *pSVar1;
  auVar573._8_8_ = 0;
  auVar573._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar267,auVar573,auVar879);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa05d);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa088);
  auVar880._8_8_ = 0;
  auVar880._0_8_ = auVar16._0_8_;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = *pSVar1;
  auVar574._8_8_ = 0;
  auVar574._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar268,auVar574,auVar880);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa0d9);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa104);
  auVar881._8_8_ = 0;
  auVar881._0_8_ = auVar16._0_8_;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *pSVar1;
  auVar575._8_8_ = 0;
  auVar575._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar269,auVar575,auVar881);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa155);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa180);
  auVar882._8_8_ = 0;
  auVar882._0_8_ = auVar16._0_8_;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = *pSVar1;
  auVar576._8_8_ = 0;
  auVar576._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar270,auVar576,auVar882);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa1d1);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa1fc);
  auVar883._8_8_ = 0;
  auVar883._0_8_ = auVar16._0_8_;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = *pSVar1;
  auVar577._8_8_ = 0;
  auVar577._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar271,auVar577,auVar883);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8fa24e);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa271);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa29c);
  SVar934 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa2bf);
  dVar9 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa2ea);
  auVar272._8_8_ = 0;
  auVar272._0_8_ = SVar934;
  auVar578._8_8_ = 0;
  auVar578._0_8_ = dVar8 * 2.0;
  auVar884._8_8_ = 0;
  auVar884._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar272,auVar578,auVar884);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa32d);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa358);
  auVar885._8_8_ = 0;
  auVar885._0_8_ = auVar16._0_8_;
  auVar579._8_8_ = 0;
  auVar579._0_8_ = dVar8 * 2.0;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar273,auVar579,auVar885);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa392);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa3bd);
  auVar886._8_8_ = 0;
  auVar886._0_8_ = auVar16._0_8_;
  auVar580._8_8_ = 0;
  auVar580._0_8_ = dVar8 * 2.0;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar274,auVar580,auVar886);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa3f7);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa422);
  auVar887._8_8_ = 0;
  auVar887._0_8_ = auVar16._0_8_;
  auVar581._8_8_ = 0;
  auVar581._0_8_ = dVar8 * 2.0;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar275,auVar581,auVar887);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa45c);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa487);
  auVar888._8_8_ = 0;
  auVar888._0_8_ = auVar16._0_8_;
  auVar582._8_8_ = 0;
  auVar582._0_8_ = dVar8 * 2.0;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar276,auVar582,auVar888);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa4c1);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa4ec);
  auVar889._8_8_ = 0;
  auVar889._0_8_ = auVar16._0_8_;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = *pSVar1;
  auVar583._8_8_ = 0;
  auVar583._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar277,auVar583,auVar889);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa53d);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa568);
  auVar890._8_8_ = 0;
  auVar890._0_8_ = auVar16._0_8_;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = *pSVar1;
  auVar584._8_8_ = 0;
  auVar584._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar278,auVar584,auVar890);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa5b9);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa5e4);
  auVar891._8_8_ = 0;
  auVar891._0_8_ = auVar16._0_8_;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = *pSVar1;
  auVar585._8_8_ = 0;
  auVar585._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar279,auVar585,auVar891);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa635);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa660);
  auVar892._8_8_ = 0;
  auVar892._0_8_ = auVar16._0_8_;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = *pSVar1;
  auVar586._8_8_ = 0;
  auVar586._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar280,auVar586,auVar892);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa6b1);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa6dc);
  auVar893._8_8_ = 0;
  auVar893._0_8_ = auVar16._0_8_;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = *pSVar1;
  auVar587._8_8_ = 0;
  auVar587._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar281,auVar587,auVar893);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa72d);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa758);
  auVar894._8_8_ = 0;
  auVar894._0_8_ = auVar16._0_8_;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *pSVar1;
  auVar588._8_8_ = 0;
  auVar588._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar282,auVar588,auVar894);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8fa7aa);
  *pSVar2 = auVar16._0_8_;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa7cd);
  dVar9 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa7fd);
  dVar14 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa83e);
  dVar15 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa87f);
  dVar10 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa8c0);
  dVar11 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa901);
  dVar12 = pow(*pSVar1,2.0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa942);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa96d);
  auVar895._8_8_ = 0;
  auVar895._0_8_ = dVar9 + dVar14 + dVar15 + dVar10 + dVar11 + dVar12;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = *pSVar1;
  auVar589._8_8_ = 0;
  auVar589._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar283,auVar589,auVar895);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa9be);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fa9e9);
  auVar896._8_8_ = 0;
  auVar896._0_8_ = auVar16._0_8_;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = *pSVar1;
  auVar590._8_8_ = 0;
  auVar590._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar284,auVar590,auVar896);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8faa3a);
  dVar8 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8faa65);
  auVar897._8_8_ = 0;
  auVar897._0_8_ = auVar16._0_8_;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = *pSVar1;
  auVar591._8_8_ = 0;
  auVar591._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar285,auVar591,auVar897);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8faab7);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8faada);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fab05);
  SVar934 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fab28);
  dVar9 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fab53);
  auVar286._8_8_ = 0;
  auVar286._0_8_ = SVar934;
  auVar592._8_8_ = 0;
  auVar592._0_8_ = dVar8 * 2.0;
  auVar898._8_8_ = 0;
  auVar898._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar286,auVar592,auVar898);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fab96);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fabc1);
  auVar899._8_8_ = 0;
  auVar899._0_8_ = auVar16._0_8_;
  auVar593._8_8_ = 0;
  auVar593._0_8_ = dVar8 * 2.0;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar287,auVar593,auVar899);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fabfb);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fac26);
  auVar900._8_8_ = 0;
  auVar900._0_8_ = auVar16._0_8_;
  auVar594._8_8_ = 0;
  auVar594._0_8_ = dVar8 * 2.0;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar288,auVar594,auVar900);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fac60);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fac8b);
  auVar901._8_8_ = 0;
  auVar901._0_8_ = auVar16._0_8_;
  auVar595._8_8_ = 0;
  auVar595._0_8_ = dVar8 * 2.0;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar289,auVar595,auVar901);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8facc5);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8facf0);
  auVar902._8_8_ = 0;
  auVar902._0_8_ = auVar16._0_8_;
  auVar596._8_8_ = 0;
  auVar596._0_8_ = dVar8 * 2.0;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar290,auVar596,auVar902);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fad2a);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fad55);
  auVar903._8_8_ = 0;
  auVar903._0_8_ = auVar16._0_8_;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = *pSVar1;
  auVar597._8_8_ = 0;
  auVar597._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar291,auVar597,auVar903);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fada6);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fadd1);
  auVar904._8_8_ = 0;
  auVar904._0_8_ = auVar16._0_8_;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = *pdVar3;
  auVar598._8_8_ = 0;
  auVar598._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar292,auVar598,auVar904);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fae22);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fae4d);
  auVar905._8_8_ = 0;
  auVar905._0_8_ = auVar16._0_8_;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = *pSVar1;
  auVar599._8_8_ = 0;
  auVar599._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar293,auVar599,auVar905);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fae9e);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8faec9);
  auVar906._8_8_ = 0;
  auVar906._0_8_ = auVar16._0_8_;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = *pdVar3;
  auVar600._8_8_ = 0;
  auVar600._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar294,auVar600,auVar906);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8faf1a);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8faf45);
  auVar907._8_8_ = 0;
  auVar907._0_8_ = auVar16._0_8_;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = *pSVar1;
  auVar601._8_8_ = 0;
  auVar601._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar295,auVar601,auVar907);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8faf96);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fafc1);
  auVar908._8_8_ = 0;
  auVar908._0_8_ = auVar16._0_8_;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = *pdVar3;
  auVar602._8_8_ = 0;
  auVar602._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar296,auVar602,auVar908);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8fb013);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb036);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb061);
  SVar934 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb084);
  dVar9 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb0af);
  auVar297._8_8_ = 0;
  auVar297._0_8_ = SVar934;
  auVar603._8_8_ = 0;
  auVar603._0_8_ = dVar8 * 2.0;
  auVar909._8_8_ = 0;
  auVar909._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar297,auVar603,auVar909);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb0f2);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb11d);
  auVar910._8_8_ = 0;
  auVar910._0_8_ = auVar16._0_8_;
  auVar604._8_8_ = 0;
  auVar604._0_8_ = dVar8 * 2.0;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar298,auVar604,auVar910);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb157);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb182);
  auVar911._8_8_ = 0;
  auVar911._0_8_ = auVar16._0_8_;
  auVar605._8_8_ = 0;
  auVar605._0_8_ = dVar8 * 2.0;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar299,auVar605,auVar911);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb1bc);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb1e7);
  auVar912._8_8_ = 0;
  auVar912._0_8_ = auVar16._0_8_;
  auVar606._8_8_ = 0;
  auVar606._0_8_ = dVar8 * 2.0;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar300,auVar606,auVar912);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb221);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb24c);
  auVar913._8_8_ = 0;
  auVar913._0_8_ = auVar16._0_8_;
  auVar607._8_8_ = 0;
  auVar607._0_8_ = dVar8 * 2.0;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar301,auVar607,auVar913);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb286);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb2b1);
  auVar914._8_8_ = 0;
  auVar914._0_8_ = auVar16._0_8_;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = *pSVar1;
  auVar608._8_8_ = 0;
  auVar608._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar302,auVar608,auVar914);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb302);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb32d);
  auVar915._8_8_ = 0;
  auVar915._0_8_ = auVar16._0_8_;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = *pdVar3;
  auVar609._8_8_ = 0;
  auVar609._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar303,auVar609,auVar915);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb37e);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb3a9);
  auVar916._8_8_ = 0;
  auVar916._0_8_ = auVar16._0_8_;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = *pSVar1;
  auVar610._8_8_ = 0;
  auVar610._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar304,auVar610,auVar916);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb3fa);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb425);
  auVar917._8_8_ = 0;
  auVar917._0_8_ = auVar16._0_8_;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = *pdVar3;
  auVar611._8_8_ = 0;
  auVar611._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar305,auVar611,auVar917);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb476);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb4a1);
  auVar918._8_8_ = 0;
  auVar918._0_8_ = auVar16._0_8_;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = *pSVar1;
  auVar612._8_8_ = 0;
  auVar612._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar306,auVar612,auVar918);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb4f2);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb51d);
  auVar919._8_8_ = 0;
  auVar919._0_8_ = auVar16._0_8_;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = *pdVar3;
  auVar613._8_8_ = 0;
  auVar613._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar307,auVar613,auVar919);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8fb56f);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb592);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb5bd);
  SVar934 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb5e0);
  dVar9 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb60b);
  auVar308._8_8_ = 0;
  auVar308._0_8_ = SVar934;
  auVar614._8_8_ = 0;
  auVar614._0_8_ = dVar8 * 2.0;
  auVar920._8_8_ = 0;
  auVar920._0_8_ = dVar9 * 2.0 * *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar308,auVar614,auVar920);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb64e);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb679);
  auVar921._8_8_ = 0;
  auVar921._0_8_ = auVar16._0_8_;
  auVar615._8_8_ = 0;
  auVar615._0_8_ = dVar8 * 2.0;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar309,auVar615,auVar921);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb6b3);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb6de);
  auVar922._8_8_ = 0;
  auVar922._0_8_ = auVar16._0_8_;
  auVar616._8_8_ = 0;
  auVar616._0_8_ = dVar8 * 2.0;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar310,auVar616,auVar922);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb718);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb743);
  auVar923._8_8_ = 0;
  auVar923._0_8_ = auVar16._0_8_;
  auVar617._8_8_ = 0;
  auVar617._0_8_ = dVar8 * 2.0;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar311,auVar617,auVar923);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb77d);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb7a8);
  auVar924._8_8_ = 0;
  auVar924._0_8_ = auVar16._0_8_;
  auVar618._8_8_ = 0;
  auVar618._0_8_ = dVar8 * 2.0;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = *pSVar1;
  auVar16 = vfmadd213sd_fma(auVar312,auVar618,auVar924);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb7e2);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb80d);
  auVar925._8_8_ = 0;
  auVar925._0_8_ = auVar16._0_8_;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = *pSVar1;
  auVar619._8_8_ = 0;
  auVar619._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar313,auVar619,auVar925);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb85e);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb889);
  auVar926._8_8_ = 0;
  auVar926._0_8_ = auVar16._0_8_;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = *pdVar3;
  auVar620._8_8_ = 0;
  auVar620._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar314,auVar620,auVar926);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb8da);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb905);
  auVar927._8_8_ = 0;
  auVar927._0_8_ = auVar16._0_8_;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = *pSVar1;
  auVar621._8_8_ = 0;
  auVar621._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar315,auVar621,auVar927);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb956);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb981);
  auVar928._8_8_ = 0;
  auVar928._0_8_ = auVar16._0_8_;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = *pdVar3;
  auVar622._8_8_ = 0;
  auVar622._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar316,auVar622,auVar928);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fb9d2);
  dVar8 = *pdVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fb9fd);
  auVar929._8_8_ = 0;
  auVar929._0_8_ = auVar16._0_8_;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = *pSVar1;
  auVar623._8_8_ = 0;
  auVar623._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar317,auVar623,auVar929);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x8fba4e);
  dVar8 = *pSVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fba79);
  auVar930._8_8_ = 0;
  auVar930._0_8_ = auVar16._0_8_;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = *pdVar3;
  auVar624._8_8_ = 0;
  auVar624._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar318,auVar624,auVar930);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8fbacb);
  *pSVar2 = auVar16._0_8_;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fbb17);
  dVar9 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fbb58);
  dVar14 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fbb99);
  dVar15 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fbbda);
  dVar10 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fbc1b);
  dVar11 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fbc5c);
  dVar12 = pow(*pdVar3,2.0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fbc9d);
  dVar8 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fbcc8);
  auVar931._8_8_ = 0;
  auVar931._0_8_ = -(RVar6 * RVar7) + dVar9 + dVar14 + dVar15 + dVar10 + dVar11 + dVar12;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = *pdVar3;
  auVar625._8_8_ = 0;
  auVar625._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar319,auVar625,auVar931);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fbd19);
  dVar8 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fbd44);
  auVar932._8_8_ = 0;
  auVar932._0_8_ = auVar16._0_8_;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = *pdVar3;
  auVar626._8_8_ = 0;
  auVar626._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar320,auVar626,auVar932);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fbd95);
  dVar8 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x8fbdc0);
  auVar933._8_8_ = 0;
  auVar933._0_8_ = auVar16._0_8_;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = *pdVar3;
  auVar627._8_8_ = 0;
  auVar627._0_8_ = -(dVar8 * 2.0);
  auVar16 = vfmadd213sd_fma(auVar321,auVar627,auVar933);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)this_00,
                      (Index)this,0x8fbe12);
  *pSVar2 = auVar16._0_8_;
  return (int)pSVar2;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::init(
    Eigen::Matrix<double,15,18> & groebnerMatrix,
    const Eigen::Matrix<double,12,1> & a,
    Eigen::Matrix<double,12,1> & n,
    Eigen::Matrix<double,12,1> & m,
    Eigen::Matrix<double,12,1> & k,
    Eigen::Vector3d & c0,
    Eigen::Vector3d & c1,
    Eigen::Vector3d & c2,
    Eigen::Vector3d & c3 )
{
  Eigen::Vector3d temp = c0-c1;
  double c01w = temp.norm()*temp.norm();
  temp = c0-c2;
  double c02w = temp.norm()*temp.norm();
  temp = c0-c3;
  double c03w = temp.norm()*temp.norm();
  temp = c1-c2;
  double c12w = temp.norm()*temp.norm();

  groebnerMatrix(0,8) = ((((((((-2*k(0,0)*k(3,0)-2*k(1,0)*k(4,0))-2*k(2,0)*k(5,0))+pow(k(0,0),2))+pow(k(3,0),2))+pow(k(1,0),2))+pow(k(4,0),2))+pow(k(2,0),2))+pow(k(5,0),2));
  groebnerMatrix(0,9) = (((((((((((2*m(0,0)*k(0,0)-2*m(0,0)*k(3,0))-2*k(0,0)*m(3,0))+2*m(3,0)*k(3,0))+2*m(1,0)*k(1,0))-2*m(1,0)*k(4,0))-2*k(1,0)*m(4,0))+2*m(4,0)*k(4,0))+2*m(2,0)*k(2,0))-2*m(2,0)*k(5,0))-2*k(2,0)*m(5,0))+2*m(5,0)*k(5,0));
  groebnerMatrix(0,10) = ((((((((-2*m(0,0)*m(3,0)-2*m(1,0)*m(4,0))-2*m(2,0)*m(5,0))+pow(m(0,0),2))+pow(m(3,0),2))+pow(m(1,0),2))+pow(m(4,0),2))+pow(m(2,0),2))+pow(m(5,0),2));
  groebnerMatrix(0,11) = (((((((((((2*n(0,0)*k(0,0)-2*n(0,0)*k(3,0))-2*k(0,0)*n(3,0))+2*n(3,0)*k(3,0))+2*n(1,0)*k(1,0))-2*n(1,0)*k(4,0))-2*k(1,0)*n(4,0))+2*n(4,0)*k(4,0))+2*n(2,0)*k(2,0))-2*n(2,0)*k(5,0))-2*k(2,0)*n(5,0))+2*n(5,0)*k(5,0));
  groebnerMatrix(0,12) = (((((((((((2*n(0,0)*m(0,0)-2*n(0,0)*m(3,0))-2*m(0,0)*n(3,0))+2*n(3,0)*m(3,0))+2*n(1,0)*m(1,0))-2*n(1,0)*m(4,0))-2*m(1,0)*n(4,0))+2*n(4,0)*m(4,0))+2*n(2,0)*m(2,0))-2*n(2,0)*m(5,0))-2*m(2,0)*n(5,0))+2*n(5,0)*m(5,0));
  groebnerMatrix(0,13) = ((((((((-2*n(0,0)*n(3,0)-2*n(1,0)*n(4,0))-2*n(2,0)*n(5,0))+pow(n(0,0),2))+pow(n(3,0),2))+pow(n(1,0),2))+pow(n(4,0),2))+pow(n(2,0),2))+pow(n(5,0),2));
  groebnerMatrix(0,14) = (((((((((((2*a(0,0)*k(0,0)-2*a(0,0)*k(3,0))-2*k(0,0)*a(3,0))+2*a(3,0)*k(3,0))+2*a(1,0)*k(1,0))-2*a(1,0)*k(4,0))-2*k(1,0)*a(4,0))+2*a(4,0)*k(4,0))+2*a(2,0)*k(2,0))-2*a(2,0)*k(5,0))-2*k(2,0)*a(5,0))+2*a(5,0)*k(5,0));
  groebnerMatrix(0,15) = (((((((((((2*a(0,0)*m(0,0)-2*a(0,0)*m(3,0))-2*m(0,0)*a(3,0))+2*a(3,0)*m(3,0))+2*a(1,0)*m(1,0))-2*a(1,0)*m(4,0))-2*m(1,0)*a(4,0))+2*a(4,0)*m(4,0))+2*a(2,0)*m(2,0))-2*a(2,0)*m(5,0))-2*m(2,0)*a(5,0))+2*a(5,0)*m(5,0));
  groebnerMatrix(0,16) = (((((((((((2*a(0,0)*n(0,0)-2*a(0,0)*n(3,0))-2*n(0,0)*a(3,0))+2*a(3,0)*n(3,0))+2*a(1,0)*n(1,0))-2*a(1,0)*n(4,0))-2*n(1,0)*a(4,0))+2*a(4,0)*n(4,0))+2*a(2,0)*n(2,0))-2*a(2,0)*n(5,0))-2*n(2,0)*a(5,0))+2*a(5,0)*n(5,0));
  groebnerMatrix(0,17) = (((((((((-c01w+pow(a(0,0),2))-2*a(0,0)*a(3,0))+pow(a(3,0),2))+pow(a(1,0),2))-2*a(1,0)*a(4,0))+pow(a(4,0),2))+pow(a(2,0),2))-2*a(2,0)*a(5,0))+pow(a(5,0),2));
  groebnerMatrix(1,8) = ((((((((-2*k(0,0)*k(6,0)-2*k(1,0)*k(7,0))-2*k(2,0)*k(8,0))+pow(k(0,0),2))+pow(k(1,0),2))+pow(k(2,0),2))+pow(k(6,0),2))+pow(k(7,0),2))+pow(k(8,0),2));
  groebnerMatrix(1,9) = (((((((((((2*m(0,0)*k(0,0)+2*m(1,0)*k(1,0))+2*m(2,0)*k(2,0))-2*m(0,0)*k(6,0))-2*k(0,0)*m(6,0))+2*m(6,0)*k(6,0))-2*m(1,0)*k(7,0))-2*k(1,0)*m(7,0))+2*m(7,0)*k(7,0))-2*m(2,0)*k(8,0))-2*k(2,0)*m(8,0))+2*m(8,0)*k(8,0));
  groebnerMatrix(1,10) = ((((((((-2*m(0,0)*m(6,0)-2*m(1,0)*m(7,0))-2*m(2,0)*m(8,0))+pow(m(0,0),2))+pow(m(1,0),2))+pow(m(2,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2));
  groebnerMatrix(1,11) = (((((((((((2*n(0,0)*k(0,0)+2*n(1,0)*k(1,0))+2*n(2,0)*k(2,0))-2*n(0,0)*k(6,0))-2*k(0,0)*n(6,0))+2*n(6,0)*k(6,0))-2*n(1,0)*k(7,0))-2*k(1,0)*n(7,0))+2*n(7,0)*k(7,0))-2*n(2,0)*k(8,0))-2*k(2,0)*n(8,0))+2*n(8,0)*k(8,0));
  groebnerMatrix(1,12) = (((((((((((2*n(0,0)*m(0,0)+2*n(1,0)*m(1,0))+2*n(2,0)*m(2,0))-2*n(0,0)*m(6,0))-2*m(0,0)*n(6,0))+2*n(6,0)*m(6,0))-2*n(1,0)*m(7,0))-2*m(1,0)*n(7,0))+2*n(7,0)*m(7,0))-2*n(2,0)*m(8,0))-2*m(2,0)*n(8,0))+2*n(8,0)*m(8,0));
  groebnerMatrix(1,13) = ((((((((-2*n(0,0)*n(6,0)-2*n(1,0)*n(7,0))-2*n(2,0)*n(8,0))+pow(n(0,0),2))+pow(n(1,0),2))+pow(n(2,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2));
  groebnerMatrix(1,14) = (((((((((((2*a(0,0)*k(0,0)+2*a(1,0)*k(1,0))+2*a(2,0)*k(2,0))-2*a(0,0)*k(6,0))-2*k(0,0)*a(6,0))+2*a(6,0)*k(6,0))-2*a(1,0)*k(7,0))-2*k(1,0)*a(7,0))+2*a(7,0)*k(7,0))-2*a(2,0)*k(8,0))-2*k(2,0)*a(8,0))+2*a(8,0)*k(8,0));
  groebnerMatrix(1,15) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))-2*a(0,0)*m(6,0))-2*m(0,0)*a(6,0))+2*a(6,0)*m(6,0))-2*a(1,0)*m(7,0))-2*m(1,0)*a(7,0))+2*a(7,0)*m(7,0))-2*a(2,0)*m(8,0))-2*m(2,0)*a(8,0))+2*a(8,0)*m(8,0));
  groebnerMatrix(1,16) = (((((((((((2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))-2*a(0,0)*n(6,0))-2*n(0,0)*a(6,0))+2*a(6,0)*n(6,0))-2*a(1,0)*n(7,0))-2*n(1,0)*a(7,0))+2*a(7,0)*n(7,0))-2*a(2,0)*n(8,0))-2*n(2,0)*a(8,0))+2*a(8,0)*n(8,0));
  groebnerMatrix(1,17) = (((((((((-c02w+pow(a(0,0),2))+pow(a(1,0),2))+pow(a(2,0),2))-2*a(0,0)*a(6,0))+pow(a(6,0),2))-2*a(1,0)*a(7,0))+pow(a(7,0),2))-2*a(2,0)*a(8,0))+pow(a(8,0),2));
  groebnerMatrix(2,8) = ((((((((pow(k(0,0),2)+pow(k(1,0),2))+pow(k(2,0),2))+pow(k(9,0),2))+pow(k(10,0),2))+pow(k(11,0),2))-2*k(0,0)*k(9,0))-2*k(1,0)*k(10,0))-2*k(2,0)*k(11,0));
  groebnerMatrix(2,9) = (((((((((((2*m(0,0)*k(0,0)+2*m(1,0)*k(1,0))+2*m(2,0)*k(2,0))-2*m(0,0)*k(9,0))-2*k(0,0)*m(9,0))+2*m(9,0)*k(9,0))-2*m(1,0)*k(10,0))-2*k(1,0)*m(10,0))+2*m(10,0)*k(10,0))-2*m(2,0)*k(11,0))-2*k(2,0)*m(11,0))+2*m(11,0)*k(11,0));
  groebnerMatrix(2,10) = ((((((((pow(m(0,0),2)+pow(m(1,0),2))+pow(m(2,0),2))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2))-2*m(0,0)*m(9,0))-2*m(1,0)*m(10,0))-2*m(2,0)*m(11,0));
  groebnerMatrix(2,11) = (((((((((((2*n(0,0)*k(0,0)+2*n(1,0)*k(1,0))+2*n(2,0)*k(2,0))-2*n(0,0)*k(9,0))-2*k(0,0)*n(9,0))+2*n(9,0)*k(9,0))-2*n(1,0)*k(10,0))-2*k(1,0)*n(10,0))+2*n(10,0)*k(10,0))-2*n(2,0)*k(11,0))-2*k(2,0)*n(11,0))+2*n(11,0)*k(11,0));
  groebnerMatrix(2,12) = (((((((((((2*n(0,0)*m(0,0)+2*n(1,0)*m(1,0))+2*n(2,0)*m(2,0))-2*n(0,0)*m(9,0))-2*m(0,0)*n(9,0))+2*n(9,0)*m(9,0))-2*n(1,0)*m(10,0))-2*m(1,0)*n(10,0))+2*n(10,0)*m(10,0))-2*n(2,0)*m(11,0))-2*m(2,0)*n(11,0))+2*n(11,0)*m(11,0));
  groebnerMatrix(2,13) = ((((((((pow(n(0,0),2)+pow(n(1,0),2))+pow(n(2,0),2))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2))-2*n(0,0)*n(9,0))-2*n(1,0)*n(10,0))-2*n(2,0)*n(11,0));
  groebnerMatrix(2,14) = (((((((((((2*a(0,0)*k(0,0)+2*a(1,0)*k(1,0))+2*a(2,0)*k(2,0))-2*a(0,0)*k(9,0))-2*k(0,0)*a(9,0))+2*a(9,0)*k(9,0))-2*a(1,0)*k(10,0))-2*k(1,0)*a(10,0))+2*a(10,0)*k(10,0))-2*a(2,0)*k(11,0))-2*k(2,0)*a(11,0))+2*a(11,0)*k(11,0));
  groebnerMatrix(2,15) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))-2*a(0,0)*m(9,0))-2*m(0,0)*a(9,0))+2*a(9,0)*m(9,0))-2*a(1,0)*m(10,0))-2*m(1,0)*a(10,0))+2*a(10,0)*m(10,0))-2*a(2,0)*m(11,0))-2*m(2,0)*a(11,0))+2*a(11,0)*m(11,0));
  groebnerMatrix(2,16) = (((((((((((2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))-2*a(0,0)*n(9,0))-2*n(0,0)*a(9,0))+2*a(9,0)*n(9,0))-2*a(1,0)*n(10,0))-2*n(1,0)*a(10,0))+2*a(10,0)*n(10,0))-2*a(2,0)*n(11,0))-2*n(2,0)*a(11,0))+2*a(11,0)*n(11,0));
  groebnerMatrix(2,17) = (((((((((-c03w+pow(a(0,0),2))+pow(a(1,0),2))+pow(a(2,0),2))-2*a(0,0)*a(9,0))+pow(a(9,0),2))-2*a(1,0)*a(10,0))+pow(a(10,0),2))-2*a(2,0)*a(11,0))+pow(a(11,0),2));
  groebnerMatrix(3,8) = ((((((((pow(k(3,0),2)+pow(k(4,0),2))+pow(k(5,0),2))+pow(k(6,0),2))+pow(k(7,0),2))+pow(k(8,0),2))-2*k(3,0)*k(6,0))-2*k(4,0)*k(7,0))-2*k(5,0)*k(8,0));
  groebnerMatrix(3,9) = (((((((((((2*m(3,0)*k(3,0)+2*m(4,0)*k(4,0))+2*m(5,0)*k(5,0))+2*m(6,0)*k(6,0))+2*m(7,0)*k(7,0))+2*m(8,0)*k(8,0))-2*m(3,0)*k(6,0))-2*k(3,0)*m(6,0))-2*m(4,0)*k(7,0))-2*k(4,0)*m(7,0))-2*m(5,0)*k(8,0))-2*k(5,0)*m(8,0));
  groebnerMatrix(3,10) = ((((((((pow(m(3,0),2)+pow(m(4,0),2))+pow(m(5,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2))-2*m(3,0)*m(6,0))-2*m(4,0)*m(7,0))-2*m(5,0)*m(8,0));
  groebnerMatrix(3,11) = (((((((((((2*n(3,0)*k(3,0)+2*n(4,0)*k(4,0))+2*n(5,0)*k(5,0))+2*n(6,0)*k(6,0))+2*n(7,0)*k(7,0))+2*n(8,0)*k(8,0))-2*n(3,0)*k(6,0))-2*k(3,0)*n(6,0))-2*n(4,0)*k(7,0))-2*k(4,0)*n(7,0))-2*n(5,0)*k(8,0))-2*k(5,0)*n(8,0));
  groebnerMatrix(3,12) = (((((((((((2*n(3,0)*m(3,0)+2*n(4,0)*m(4,0))+2*n(5,0)*m(5,0))+2*n(6,0)*m(6,0))+2*n(7,0)*m(7,0))+2*n(8,0)*m(8,0))-2*n(3,0)*m(6,0))-2*m(3,0)*n(6,0))-2*n(4,0)*m(7,0))-2*m(4,0)*n(7,0))-2*n(5,0)*m(8,0))-2*m(5,0)*n(8,0));
  groebnerMatrix(3,13) = ((((((((pow(n(3,0),2)+pow(n(4,0),2))+pow(n(5,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2))-2*n(3,0)*n(6,0))-2*n(4,0)*n(7,0))-2*n(5,0)*n(8,0));
  groebnerMatrix(3,14) = (((((((((((2*a(3,0)*k(3,0)+2*a(4,0)*k(4,0))+2*a(5,0)*k(5,0))+2*a(6,0)*k(6,0))+2*a(7,0)*k(7,0))+2*a(8,0)*k(8,0))-2*a(3,0)*k(6,0))-2*k(3,0)*a(6,0))-2*a(4,0)*k(7,0))-2*k(4,0)*a(7,0))-2*a(5,0)*k(8,0))-2*k(5,0)*a(8,0));
  groebnerMatrix(3,15) = (((((((((((2*a(3,0)*m(3,0)+2*a(4,0)*m(4,0))+2*a(5,0)*m(5,0))+2*a(6,0)*m(6,0))+2*a(7,0)*m(7,0))+2*a(8,0)*m(8,0))-2*a(3,0)*m(6,0))-2*m(3,0)*a(6,0))-2*a(4,0)*m(7,0))-2*m(4,0)*a(7,0))-2*a(5,0)*m(8,0))-2*m(5,0)*a(8,0));
  groebnerMatrix(3,16) = (((((((((((2*a(3,0)*n(3,0)+2*a(4,0)*n(4,0))+2*a(5,0)*n(5,0))+2*a(6,0)*n(6,0))+2*a(7,0)*n(7,0))+2*a(8,0)*n(8,0))-2*a(3,0)*n(6,0))-2*n(3,0)*a(6,0))-2*a(4,0)*n(7,0))-2*n(4,0)*a(7,0))-2*a(5,0)*n(8,0))-2*n(5,0)*a(8,0));
  groebnerMatrix(3,17) = (((((((((-c12w+pow(a(3,0),2))+pow(a(4,0),2))+pow(a(5,0),2))+pow(a(6,0),2))+pow(a(7,0),2))+pow(a(8,0),2))-2*a(3,0)*a(6,0))-2*a(4,0)*a(7,0))-2*a(5,0)*a(8,0));
}